

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.hpp
# Opt level: O0

void __thiscall
ot::commissioner::DtlsSession::DtlsTimer::DtlsTimer
          (DtlsTimer *this,event_base *aEventBase,Action *aAction)

{
  function<void_(ot::commissioner::Timer_&)> local_40;
  Action *local_20;
  Action *aAction_local;
  event_base *aEventBase_local;
  DtlsTimer *this_local;
  
  local_20 = aAction;
  aAction_local = (Action *)aEventBase;
  aEventBase_local = (event_base *)this;
  std::function<void_(ot::commissioner::Timer_&)>::function(&local_40,aAction);
  Timer::Timer(&this->super_Timer,aEventBase,&local_40,true);
  std::function<void_(ot::commissioner::Timer_&)>::~function(&local_40);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->mIntermediate);
  this->mCancelled = false;
  return;
}

Assistant:

DtlsTimer(struct event_base *aEventBase, Action aAction)
            : Timer(aEventBase, aAction)
            , mCancelled(false)
        {
        }